

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EventTriggerStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EventTriggerStatement,slang::ast::Expression_const&,slang::ast::TimingControl_const*&,bool&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,TimingControl **args_1,bool *args_2,
          SourceRange *args_3)

{
  SourceRange sourceRange;
  EventTriggerStatement *pEVar1;
  EventTriggerStatement *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Expression *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pEVar1 = (EventTriggerStatement *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::EventTriggerStatement::EventTriggerStatement
            (in_RCX,in_R8,(TimingControl *)(in_R8->type).ptr,
             SUB81((ulong)*(undefined8 *)in_R8 >> 0x38,0),sourceRange);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }